

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_gfx_update_texture
               (uint id,int width,int height,rf_pixel_format format,void *pixels,int pixels_size)

{
  int iVar1;
  rf_gfx_pixel_format rVar2;
  
  iVar1 = rf_bytes_per_pixel(format);
  if (pixels_size < iVar1 * height * width) {
    (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0xde1,id);
    rVar2 = rf_gfx_get_internal_texture_formats(format);
    if (format - RF_UNCOMPRESSED_GRAYSCALE < 10 && (rVar2._8_8_ >> 0x20 & 1) != 0) {
      (*(rf__ctx->field_0).gfx_ctx.gl.TexSubImage2D)
                (0xde1,0,0,0,width,height,rVar2.internal_format,rVar2.type,pixels);
    }
    else {
      rf_log_impl(4,0x1745ef);
    }
  }
  return;
}

Assistant:

RF_API void rf_gfx_update_texture(unsigned int id, int width, int height, rf_pixel_format format, const void* pixels, int pixels_size)
{
    if (width * height * rf_bytes_per_pixel(format) <= pixels_size) return;

    rf_gl.BindTexture(GL_TEXTURE_2D, id);

    rf_gfx_pixel_format gfx_format = rf_gfx_get_internal_texture_formats(format);

    if (gfx_format.valid && rf_is_uncompressed_format(format))
    {
        rf_gl.TexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, width, height, gfx_format.internal_format, gfx_format.type, (unsigned char*) pixels);
    }
    else RF_LOG(RF_LOG_TYPE_WARNING, "rf_texture format updating not supported");
}